

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_X86.cpp
# Opt level: O0

void __thiscall ExecutorX86::SaveListing(ExecutorX86 *this,OutputContext *output)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  x86Instruction *this_00;
  uint *puVar5;
  ExternFuncInfo *pEVar6;
  RegVmCmd *pRVar7;
  byte *pbVar8;
  char *pcVar9;
  uint local_120;
  uint local_11c;
  uint k_2;
  uint k_1;
  uint postKillCount;
  uint preKillCount;
  uint regKillCounts;
  uint regKillInfoOffset;
  RegVmCmd *cmd;
  ExternFuncInfo *funcInfo;
  uint local_f0;
  uint e;
  uint k;
  uint functionId;
  char *functionName;
  uint instID;
  x86Instruction *inst;
  char local_c8 [4];
  uint i;
  char instBuf [128];
  undefined1 local_40 [4];
  uint instBufSize;
  TraceScope traceScope;
  OutputContext *output_local;
  ExecutorX86 *this_local;
  
  if ((SaveListing(OutputContext&)::token == '\0') &&
     (iVar2 = __cxa_guard_acquire(&SaveListing(OutputContext&)::token), iVar2 != 0)) {
    SaveListing::token = NULLC::TraceGetToken("x86","SaveListing");
    __cxa_guard_release(&SaveListing(OutputContext&)::token);
  }
  NULLC::TraceScope::TraceScope((TraceScope *)local_40,SaveListing::token);
  instBuf[0x7c] = -0x80;
  instBuf[0x7d] = '\0';
  instBuf[0x7e] = '\0';
  instBuf[0x7f] = '\0';
  inst._4_4_ = 0;
  do {
    uVar3 = FastVector<x86Instruction,_true,_true>::size(&this->instList);
    if (uVar3 <= inst._4_4_) {
      OutputContext::Flush(output);
      NULLC::TraceScope::~TraceScope((TraceScope *)local_40);
      return;
    }
    this_00 = FastVector<x86Instruction,_true,_true>::operator[](&this->instList,inst._4_4_);
    uVar3 = this_00->instID;
    if ((uVar3 != 0) &&
       (puVar5 = FastVector<unsigned_int,_false,_false>::operator[]
                           (&this->codeJumpTargets,uVar3 - 1), *puVar5 != 0)) {
      _k = (char *)0x0;
      e = 0;
      local_f0 = 0;
      uVar4 = FastVector<ExternFuncInfo,_false,_false>::size(&this->exLinker->exFunctions);
      for (; local_f0 != uVar4; local_f0 = local_f0 + 1) {
        pEVar6 = FastVector<ExternFuncInfo,_false,_false>::operator[]
                           (&this->exLinker->exFunctions,local_f0);
        if (pEVar6->regVmAddress == uVar3 - 1) {
          _k = (this->exLinker->exSymbols).data + pEVar6->offsetToName;
          e = local_f0;
          break;
        }
      }
      OutputContext::Print(output,"; ------------------- Invalidation ----------------\n");
      if (_k == (char *)0x0) {
        OutputContext::Printf(output,"0x%x: ; %4d",(ulong)(uVar3 - 1 | 0xc0000000));
      }
      else {
        OutputContext::Printf
                  (output,"0x%x: ; %4d // %s#%d",(ulong)(uVar3 - 1 | 0xc0000000),(ulong)(uVar3 - 1),
                   _k,(ulong)e);
      }
      OutputContext::Print(output,'\n');
    }
    if ((uVar3 != 0) &&
       (uVar4 = FastVector<RegVmCmd,_false,_false>::size(this->exRegVmCode), uVar3 - 1 < uVar4)) {
      pRVar7 = FastVector<RegVmCmd,_false,_false>::operator[](this->exRegVmCode,uVar3 - 1);
      OutputContext::Printf(output,"; %4d: ",(ulong)(uVar3 - 1));
      PrintInstruction(output,(char *)this->exRegVmConstants->data,this->exFunctions->data,
                       (this->exLinker->exSymbols).data,(uint)pRVar7->code,pRVar7->rA,pRVar7->rB,
                       pRVar7->rC,pRVar7->argument,(VmConstant *)0x0);
      puVar5 = FastVector<unsigned_int,_false,_false>::operator[]
                         (&this->codeRegKillInfoOffsets,uVar3 - 1);
      uVar3 = *puVar5;
      pbVar8 = FastVector<unsigned_char,_false,_false>::operator[](this->exRegVmRegKillInfo,uVar3);
      bVar1 = *pbVar8;
      if (bVar1 != 0) {
        OutputContext::Print(output," // kill");
        preKillCount = uVar3 + 1;
        if (bVar1 >> 4 != 0) {
          OutputContext::Print(output," early[");
          for (local_11c = 0; local_11c < bVar1 >> 4; local_11c = local_11c + 1) {
            pcVar9 = ", ";
            if (local_11c == 0) {
              pcVar9 = "";
            }
            pbVar8 = FastVector<unsigned_char,_false,_false>::operator[]
                               (this->exRegVmRegKillInfo,preKillCount);
            OutputContext::Printf(output,"%sr%d",pcVar9,(ulong)*pbVar8);
            preKillCount = preKillCount + 1;
          }
          OutputContext::Print(output,']');
        }
        if ((bVar1 & 0xf) != 0) {
          OutputContext::Print(output," late[");
          for (local_120 = 0; local_120 < (bVar1 & 0xf); local_120 = local_120 + 1) {
            pcVar9 = ", ";
            if (local_120 == 0) {
              pcVar9 = "";
            }
            pbVar8 = FastVector<unsigned_char,_false,_false>::operator[]
                               (this->exRegVmRegKillInfo,preKillCount);
            OutputContext::Printf(output,"%sr%d",pcVar9,(ulong)*pbVar8);
            preKillCount = preKillCount + 1;
          }
          OutputContext::Print(output,']');
        }
      }
      OutputContext::Print(output,'\n');
    }
    x86Instruction::Decode(this_00,&this->vmState,local_c8,0x80);
    OutputContext::Print(output,local_c8);
    OutputContext::Print(output,'\n');
    inst._4_4_ = inst._4_4_ + 1;
  } while( true );
}

Assistant:

void ExecutorX86::SaveListing(OutputContext &output)
{
	TRACE_SCOPE("x86", "SaveListing");

	const unsigned instBufSize = 128;
	char instBuf[instBufSize];

	for(unsigned i = 0; i < instList.size(); i++)
	{
		x86Instruction &inst = instList[i];

		unsigned instID = inst.instID;

		if(instID && codeJumpTargets[instID - 1])
		{
			const char *functionName = NULL;
			unsigned functionId = 0;

			for(unsigned k = 0, e = exLinker->exFunctions.size(); k != e; k++)
			{
				ExternFuncInfo &funcInfo = exLinker->exFunctions[k];

				if(unsigned(funcInfo.regVmAddress) == instID - 1)
				{
					functionName = funcInfo.offsetToName + exLinker->exSymbols.data;
					functionId = k;
					break;
				}
			}

			output.Print("; ------------------- Invalidation ----------------\n");

			if(functionName)
				output.Printf("0x%x: ; %4d // %s#%d", 0xc0000000 | (instID - 1), instID - 1, functionName, functionId);
			else
				output.Printf("0x%x: ; %4d", 0xc0000000 | (instID - 1), instID - 1);

			output.Print('\n');
		}

		if(instID && instID - 1 < exRegVmCode.size())
		{
			RegVmCmd &cmd = exRegVmCode[instID - 1];

			output.Printf("; %4d: ", instID - 1);

			PrintInstruction(output, (char*)exRegVmConstants.data, exFunctions.data, exLinker->exSymbols.data, RegVmInstructionCode(cmd.code), cmd.rA, cmd.rB, cmd.rC, cmd.argument, NULL);

			unsigned regKillInfoOffset = codeRegKillInfoOffsets[instID - 1];
			unsigned regKillCounts = exRegVmRegKillInfo[regKillInfoOffset];

			if(regKillCounts)
			{
				output.Print(" // kill");

				regKillInfoOffset++;

				unsigned preKillCount = (regKillCounts >> 4);
				unsigned postKillCount = (regKillCounts & 0xf);

				if(preKillCount)
				{
					output.Print(" early[");

					for(unsigned k = 0; k < preKillCount; k++)
						output.Printf("%sr%d", k == 0 ? "" : ", ", exRegVmRegKillInfo[regKillInfoOffset++]);

					output.Print(']');
				}

				if(postKillCount)
				{
					output.Print(" late[");

					for(unsigned k = 0; k < postKillCount; k++)
						output.Printf("%sr%d", k == 0 ? "" : ", ", exRegVmRegKillInfo[regKillInfoOffset++]);

					output.Print(']');
				}
			}

			output.Print('\n');
		}

		inst.Decode(vmState, instBuf, instBufSize);

		output.Print(instBuf);
		output.Print('\n');
	}

	output.Flush();
}